

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

ggml_status __thiscall
llama_context::graph_compute(llama_context *this,ggml_cgraph *gf,bool batched)

{
  bool bVar1;
  ggml_status gVar2;
  undefined8 uVar3;
  reference ppVar4;
  pointer pgVar5;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  ggml_status status;
  pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)> *set_n_threads_fn;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
  *__range1;
  _func_void_ggml_backend_t_ggml_threadpool_t *set_threadpool_fn;
  ggml_backend_reg *reg;
  ggml_threadpool_t tp;
  int n_threads;
  vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
  *__lhs;
  int local_64;
  __normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
  local_40;
  long local_38;
  code *local_30;
  undefined8 local_28;
  __normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
  *local_20;
  int local_18;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  if (local_11 == 0) {
    local_64 = *(int *)(in_RDI + 0x18);
  }
  else {
    local_64 = *(int *)(in_RDI + 0x1c);
  }
  local_18 = local_64;
  if (local_11 == 0) {
    __lhs = *(__normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
              **)(in_RDI + 0x2d0);
  }
  else {
    __lhs = *(__normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
              **)(in_RDI + 0x2d8);
  }
  local_20 = __lhs;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x2a8) != 0) {
    uVar3 = ggml_backend_get_device(*(undefined8 *)(in_RDI + 0x2a8));
    local_28 = ggml_backend_dev_backend_reg(uVar3);
    local_30 = (code *)ggml_backend_reg_get_proc_address(local_28,"ggml_backend_cpu_set_threadpool")
    ;
    (*local_30)(*(undefined8 *)(in_RDI + 0x2a8),local_20);
  }
  local_38 = in_RDI + 0x2f0;
  local_40._M_current =
       (pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)> *)
       std::
       vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
       ::begin(in_stack_ffffffffffffff88);
  std::
  vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
  ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
                              *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
             ::operator*(&local_40);
    (*ppVar4->second)(ppVar4->first,local_18);
    __gnu_cxx::
    __normal_iterator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_*,_std::vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>_>
    ::operator++(&local_40);
  }
  pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                     ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)__lhs);
  gVar2 = ggml_backend_sched_graph_compute_async(pgVar5,local_10);
  if (gVar2 != GGML_STATUS_SUCCESS) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: ggml_backend_sched_graph_compute_async failed with error %d\n",
                       "graph_compute",(ulong)(uint)gVar2);
  }
  return gVar2;
}

Assistant:

ggml_status llama_context::graph_compute(
            ggml_cgraph * gf,
                   bool   batched) {
    int n_threads        = batched ? cparams.n_threads_batch : cparams.n_threads;
    ggml_threadpool_t tp = batched ? threadpool_batch        : threadpool;

    if (backend_cpu != nullptr) {
        auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend_cpu));
        auto * set_threadpool_fn = (decltype(ggml_backend_cpu_set_threadpool) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_set_threadpool");
        set_threadpool_fn(backend_cpu, tp);
    }

    // set the number of threads for all the backends
    for (const auto & set_n_threads_fn : set_n_threads_fns) {
        set_n_threads_fn.second(set_n_threads_fn.first, n_threads);
    }

    auto status = ggml_backend_sched_graph_compute_async(sched.get(), gf);
    if (status != GGML_STATUS_SUCCESS) {
        LLAMA_LOG_ERROR("%s: ggml_backend_sched_graph_compute_async failed with error %d\n", __func__, status);
    }

    // fprintf(stderr, "splits: %d\n", ggml_backend_sched_get_n_splits(sched));

    return status;
}